

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_entry_compare_acls
                  (char *file,wchar_t line,archive_entry *ae,archive_test_acl_t *acls,wchar_t cnt,
                  wchar_t want_type,wchar_t mode)

{
  char cVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  mode_t mVar8;
  ulong uVar9;
  archive_test_acl_t *paVar10;
  ulong uVar11;
  int *piVar12;
  char *pcVar13;
  long lVar14;
  int iVar15;
  wchar_t local_a4;
  wchar_t permset;
  uint local_8c;
  archive_entry *local_88;
  char *local_80;
  archive_test_acl_t *local_78;
  int *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  wchar_t qual;
  wchar_t tag;
  wchar_t type;
  ulong local_48;
  ulong local_40;
  char *name;
  
  msg = nextmsg;
  assertions = assertions + L'\x01';
  nextmsg = (char *)0x0;
  local_70 = (int *)malloc((long)cnt * 4);
  uVar9 = 0;
  uVar11 = (ulong)(uint)cnt;
  if (cnt < L'\x01') {
    uVar11 = uVar9;
  }
  iVar15 = 0;
  paVar10 = acls;
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    if ((paVar10->type & want_type) != 0) {
      local_70[iVar15] = (int)uVar9;
      iVar15 = iVar15 + 1;
    }
    paVar10 = paVar10 + 1;
  }
  if (iVar15 == 0) {
    failure_start(file,line,"No ACL\'s to compare, type mask: %d",(ulong)(uint)want_type);
    local_a4 = L'\x01';
  }
  else {
    local_8c = mode & 7;
    local_5c = mode & 0x38;
    local_64 = (uint)mode >> 3 & 7;
    local_58 = mode & 0x1c0;
    local_60 = (uint)mode >> 6 & 7;
    local_a4 = L'\0';
    local_88 = ae;
    local_78 = acls;
LAB_001180ae:
    while (wVar5 = archive_entry_acl_next(ae,want_type,&type,&permset,&tag,&qual,&name),
          wVar4 = type, wVar3 = tag, wVar5 == L'\0') {
      uVar9 = (ulong)(uint)qual;
      local_80 = name;
      lVar14 = 0;
      uVar11 = (ulong)(uint)permset;
      bVar2 = false;
      piVar12 = local_70;
      paVar10 = local_78;
      while( true ) {
        ae = local_88;
        if ((iVar15 <= lVar14) || (bVar2)) break;
        iVar6 = piVar12[lVar14];
        bVar2 = false;
        if (((paVar10[iVar6].type == wVar4) && (paVar10[iVar6].permset == (wchar_t)uVar11)) &&
           (paVar10[iVar6].tag == wVar3)) {
          if ((((uint)(wVar3 + L'\xffffd8ee') < 5) &&
              ((0x15U >> (wVar3 + L'\xffffd8ee' & 0x1fU) & 1) != 0)) || (wVar3 == L'❻')) {
LAB_00118164:
            piVar12[lVar14] = piVar12[(long)iVar15 + -1];
            iVar15 = iVar15 + -1;
            bVar2 = true;
          }
          else if (paVar10[iVar6].qual == (wchar_t)uVar9) {
            pcVar13 = paVar10[iVar6].name;
            if (local_80 == (char *)0x0) {
              if (pcVar13 == (char *)0x0) goto LAB_00118164;
              cVar1 = *pcVar13;
            }
            else {
              if (pcVar13 != (char *)0x0) {
                local_48 = uVar9;
                local_40 = uVar11;
                iVar6 = strcmp(local_80,pcVar13);
                piVar12 = local_70;
                paVar10 = local_78;
                uVar11 = local_40;
                uVar9 = local_48;
                if (iVar6 == 0) goto LAB_00118164;
                goto LAB_00118175;
              }
              cVar1 = *local_80;
            }
            if (cVar1 == '\0') goto LAB_00118164;
          }
        }
LAB_00118175:
        lVar14 = lVar14 + 1;
      }
      uVar7 = wVar4 ^ 0x100;
      if (wVar3 == L'✒' && uVar7 == 0) goto LAB_00118256;
      if (wVar3 == L'✔' && uVar7 == 0) {
        if (!bVar2) {
          failure_start(file,line,"No match for group_obj perm");
          failure_finish((void *)0x0);
          uVar11 = (ulong)(uint)permset;
          local_a4 = L'\x01';
        }
        ae = local_88;
        if ((int)uVar11 * 8 != local_5c) {
          pcVar13 = "GROUP_OBJ permset (%02o) != group mode (%02o)";
          uVar11 = uVar11 & 0xffffffff;
          uVar9 = (ulong)local_64;
          goto LAB_00118371;
        }
      }
      else if (uVar7 == 0 && wVar3 == L'✖') {
        if (!bVar2) {
          failure_start(file,line,"No match for other perm");
          failure_finish((void *)0x0);
          uVar11 = (ulong)(uint)permset;
          local_a4 = L'\x01';
        }
        ae = local_88;
        if ((uint)uVar11 != local_8c) {
          pcVar13 = "OTHER permset (%02o) != other mode (%02o)";
          uVar11 = uVar11 & 0xffffffff;
          uVar9 = (ulong)local_8c;
          goto LAB_00118371;
        }
      }
      else if (!bVar2) {
        failure_start(file,line,
                      "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                      ,(ulong)(uint)wVar4,uVar11 & 0xffffffff,(ulong)(uint)wVar3,uVar9,local_80);
        goto LAB_00118378;
      }
    }
    if (wVar5 != L'\x01') {
      failure_start(file,line,"Should not exit before EOF");
      failure_finish((void *)0x0);
      local_a4 = L'\x01';
    }
    if ((((uint)want_type >> 8 & 1) != 0) &&
       (mVar8 = archive_entry_mode(ae), ((mVar8 ^ mode) & 0x1ffU) != 0)) {
      mVar8 = archive_entry_mode(ae);
      failure_start(file,line,"Mode (%02o) and entry mode (%02o) mismatch",(ulong)(uint)mode,
                    (ulong)mVar8);
      failure_finish((void *)0x0);
      local_a4 = L'\x01';
    }
    piVar12 = local_70;
    if (iVar15 != 0) {
      iVar15 = *local_70;
      failure_start(file,line,
                    "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                    ,(ulong)(uint)local_78[iVar15].type,(ulong)(uint)local_78[iVar15].permset,
                    (ulong)(uint)local_78[iVar15].tag,(ulong)(uint)local_78[iVar15].qual,
                    local_78[iVar15].name);
      failure_finish((void *)0x0);
      local_a4 = L'\x01';
    }
    free(piVar12);
  }
  return local_a4;
LAB_00118256:
  if (!bVar2) {
    failure_start(file,line,"No match for user_obj perm");
    failure_finish((void *)0x0);
    uVar11 = (ulong)(uint)permset;
    local_a4 = L'\x01';
  }
  ae = local_88;
  if ((int)uVar11 << 6 != local_58) {
    pcVar13 = "USER_OBJ permset (%02o) != user mode (%02o)";
    uVar11 = uVar11 & 0xffffffff;
    uVar9 = (ulong)local_60;
LAB_00118371:
    ae = local_88;
    failure_start(file,line,pcVar13,uVar11,uVar9);
LAB_00118378:
    failure_finish((void *)0x0);
    local_a4 = L'\x01';
  }
  goto LAB_001180ae;
}

Assistant:

int
assertion_entry_compare_acls(const char *file, int line,
    struct archive_entry *ae, struct archive_test_acl_t *acls, int cnt,
    int want_type, int mode)
{
	int *marker;
	int i, r, n, ret;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	assertion_count(file, line);

	ret = 0;
	n = 0;
	marker = malloc(sizeof(marker[0]) * cnt);

	for (i = 0; i < cnt; i++) {
		if ((acls[i].type & want_type) != 0) {
			marker[n] = i;
			n++;
		}
	}

	if (n == 0) {
		failure_start(file, line, "No ACL's to compare, type mask: %d",
		    want_type);
		return (1);
	}

	while (0 == (r = archive_entry_acl_next(ae, want_type,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (archive_test_acl_match(&acls[marker[i]], type,
			    permset, tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_USER_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "user_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 6) != (mode & 0700)) {
				failure_start(file, line, "USER_OBJ permset "
				    "(%02o) != user mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 6)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "group_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 3) != (mode & 0070)) {
				failure_start(file, line, "GROUP_OBJ permset "
				    "(%02o) != group mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 3)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_OTHER) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "other perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 0) != (mode & 0007)) {
				failure_start(file, line, "OTHER permset "
				    "(%02o) != other mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)mode & 07);
				failure_finish(NULL);
				ret = 1;
			}
		} else if (matched != 1) {
			failure_start(file, line, "Could not find match for "
			    "ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,"
			    "name=``%s'')", (unsigned int)type,
			    (unsigned int)permset, tag, qual, name);
			failure_finish(NULL);
			ret = 1;
		}
	}
	if (r != ARCHIVE_EOF) {
		failure_start(file, line, "Should not exit before EOF");
		failure_finish(NULL);
		ret = 1;
	}
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0 &&
	    (mode_t)(mode & 0777) != (archive_entry_mode(ae) & 0777)) {
		failure_start(file, line, "Mode (%02o) and entry mode (%02o) "
		    "mismatch", (unsigned int)mode,
		    (unsigned int)archive_entry_mode(ae));
		failure_finish(NULL);
		ret = 1;
	}
	if (n != 0) {
		failure_start(file, line, "Could not find match for ACL "
		    "(type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s'')",
		    (unsigned int)acls[marker[0]].type,
		    (unsigned int)acls[marker[0]].permset,
		    acls[marker[0]].tag, acls[marker[0]].qual,
		    acls[marker[0]].name);
		failure_finish(NULL);
		ret = 1;
		/* Number of ACLs not matched should == 0 */
	}
	free(marker);
	return (ret);
}